

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O2

int cd_type_init(parser_info *info,char **attr)

{
  node_info *pnVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  coda_type_text *pcVar5;
  
  pcVar4 = get_attribute_value(attr,"name");
  if (pcVar4 == (char *)0x0) {
    iVar2 = handle_format_attribute_for_type(info,attr);
    iVar3 = -1;
    if (iVar2 == 0) {
      pnVar1 = info->node;
      pnVar1->free_data = coda_type_release;
      pcVar5 = coda_type_text_new(pnVar1->format);
      pnVar1 = info->node;
      pnVar1->data = pcVar5;
      if (pcVar5 != (coda_type_text *)0x0) {
        register_type_elements(pnVar1,cd_type_set_type);
        pnVar1 = info->node;
        pnVar1->init_sub_element[0xb] = string_data_init;
        pnVar1->add_element_to_parent[0xb] = type_set_description;
        pnVar1 = info->node;
        pnVar1->init_sub_element[4] = cd_attribute_init;
        pnVar1->add_element_to_parent[4] = type_add_attribute;
        iVar3 = handle_xml_name(info,attr);
        iVar3 = -(uint)(iVar3 != 0);
      }
    }
  }
  else {
    coda_set_error(-400,"attribute \'name\' not allowed for Type");
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

static int cd_type_init(parser_info *info, const char **attr)
{
    if (get_attribute_value(attr, "name") != NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "attribute 'name' not allowed for Type");
        return -1;
    }
    if (handle_format_attribute_for_type(info, attr) != 0)
    {
        return -1;
    }
    info->node->free_data = (free_data_handler)coda_type_release;
    /* create dummy type where a description and attributes can be stored */
    info->node->data = coda_type_text_new(info->node->format);
    if (info->node->data == NULL)
    {
        return -1;
    }
    register_type_elements(info->node, cd_type_set_type);
    register_sub_element(info->node, element_cd_description, string_data_init, type_set_description);
    register_sub_element(info->node, element_cd_attribute, cd_attribute_init, type_add_attribute);

    if (handle_xml_name(info, attr) != 0)
    {
        return -1;
    }

    return 0;
}